

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.hpp
# Opt level: O3

void __thiscall
rsg::FunctionGenerator::requireAssignment(FunctionGenerator *this,Variable *variable)

{
  pointer *pppVVar1;
  iterator __position;
  Variable *local_8;
  
  __position._M_current =
       (this->m_requiredAssignments).
       super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_requiredAssignments).
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = variable;
    std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
    _M_realloc_insert<rsg::Variable*const&>
              ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)&this->m_requiredAssignments
               ,__position,&local_8);
  }
  else {
    *__position._M_current = variable;
    pppVVar1 = &(this->m_requiredAssignments).
                super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return;
}

Assistant:

void					requireAssignment			(Variable* variable) { m_requiredAssignments.push_back(variable); }